

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value chaiscript::Boxed_Number::oper(Opers t_oper,Boxed_Value *t_lhs)

{
  Common_Types CVar1;
  undefined8 uVar2;
  bad_any_cast *this;
  undefined8 in_RDX;
  Opers t_oper_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_ESI;
  element_type *in_RDI;
  type tVar4;
  Boxed_Value BVar5;
  undefined4 in_stack_fffffffffffffff0;
  element_type *peVar6;
  Opers t_oper_01;
  
  t_oper_00 = (Opers)((ulong)in_RDX >> 0x20);
  peVar6 = in_RDI;
  CVar1 = get_common_type((Boxed_Value *)in_RDI);
  this = (bad_any_cast *)(ulong)CVar1;
  t_oper_01 = (Opers)((ulong)peVar6 >> 0x20);
  switch(this) {
  case (bad_any_cast *)0x0:
    tVar4 = go<int>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x1:
    tVar4 = go<double>(t_oper_00,(Boxed_Value *)this);
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x2:
    tVar4 = go<unsigned_char>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x3:
    tVar4 = go<signed_char>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x4:
    tVar4 = go<unsigned_short>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x5:
    tVar4 = go<short>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x6:
    tVar4 = go<unsigned_int>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x7:
    tVar4 = go<unsigned_long>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x8:
    tVar4 = go<long>(t_oper_01,(Boxed_Value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x9:
    tVar4 = go<float>(t_oper_00,(Boxed_Value *)this);
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0xa:
    tVar4 = go<long_double>(t_oper_00,(Boxed_Value *)this);
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast(this);
    __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static Boxed_Value oper(Operators::Opers t_oper, const Boxed_Value &t_lhs)
        {
          switch (get_common_type(t_lhs)) {
            case Common_Types::t_int32:
              return go<int32_t>(t_oper, t_lhs);
            case Common_Types::t_uint8:
              return go<uint8_t>(t_oper, t_lhs);
            case Common_Types::t_int8:
              return go<int8_t>(t_oper, t_lhs);
            case Common_Types::t_uint16:
              return go<uint16_t>(t_oper, t_lhs);
            case Common_Types::t_int16:
              return go<int16_t>(t_oper, t_lhs);
            case Common_Types::t_uint32:
              return go<uint32_t>(t_oper, t_lhs);
            case Common_Types::t_uint64:
              return go<uint64_t>(t_oper, t_lhs);
            case Common_Types::t_int64:
              return go<int64_t>(t_oper, t_lhs);
            case Common_Types::t_double:
              return go<double>(t_oper, t_lhs);
            case Common_Types::t_float:
              return go<float>(t_oper, t_lhs);
            case Common_Types::t_long_double:
              return go<long double>(t_oper, t_lhs);
          }

          throw chaiscript::detail::exception::bad_any_cast();
        }